

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydataops.h
# Opt level: O0

void __thiscall
QtPrivate::QPodArrayOps<void*>::emplace<void*&>(QPodArrayOps<void_*> *this,qsizetype i,void **args)

{
  undefined1 uVar1;
  qsizetype qVar2;
  void **ppvVar3;
  undefined8 *in_RDX;
  long in_RSI;
  QArrayDataPointer<void_*> *in_RDI;
  void **where;
  GrowthPosition pos;
  void *tmp;
  bool detach;
  QArrayDataPointer<void_*> *in_stack_ffffffffffffffc8;
  undefined4 in_stack_ffffffffffffffd0;
  undefined4 uVar4;
  void *pvVar5;
  undefined7 in_stack_ffffffffffffffe0;
  
  uVar1 = QArrayDataPointer<void_*>::needsDetach(in_RDI);
  if (!(bool)uVar1) {
    if ((in_RSI == in_RDI->size) &&
       (qVar2 = QArrayDataPointer<void_*>::freeSpaceAtEnd(in_stack_ffffffffffffffc8), qVar2 != 0)) {
      ppvVar3 = QArrayDataPointer<void_*>::end(in_RDI);
      *ppvVar3 = (void *)*in_RDX;
      in_RDI->size = in_RDI->size + 1;
      return;
    }
    if ((in_RSI == 0) &&
       (qVar2 = QArrayDataPointer<void_*>::freeSpaceAtBegin(in_stack_ffffffffffffffc8), qVar2 != 0))
    {
      ppvVar3 = QArrayDataPointer<void_*>::begin((QArrayDataPointer<void_*> *)0x40c687);
      ppvVar3[-1] = (void *)*in_RDX;
      in_RDI->ptr = in_RDI->ptr + -1;
      in_RDI->size = in_RDI->size + 1;
      return;
    }
  }
  pvVar5 = (void *)*in_RDX;
  uVar4 = 0;
  if ((in_RDI->size != 0) && (in_RSI == 0)) {
    uVar4 = 1;
  }
  QArrayDataPointer<void_*>::detachAndGrow
            ((QArrayDataPointer<void_*> *)CONCAT17(uVar1,in_stack_ffffffffffffffe0),
             (GrowthPosition)((ulong)pvVar5 >> 0x20),CONCAT44(uVar4,in_stack_ffffffffffffffd0),
             (void ***)in_stack_ffffffffffffffc8,in_RDI);
  ppvVar3 = QPodArrayOps<void_*>::createHole
                      ((QPodArrayOps<void_*> *)CONCAT17(uVar1,in_stack_ffffffffffffffe0),
                       (GrowthPosition)((ulong)pvVar5 >> 0x20),
                       CONCAT44(uVar4,in_stack_ffffffffffffffd0),
                       (qsizetype)in_stack_ffffffffffffffc8);
  *ppvVar3 = pvVar5;
  return;
}

Assistant:

void emplace(qsizetype i, Args &&... args)
    {
        bool detach = this->needsDetach();
        if (!detach) {
            if (i == this->size && this->freeSpaceAtEnd()) {
                new (this->end()) T(std::forward<Args>(args)...);
                ++this->size;
                return;
            }
            if (i == 0 && this->freeSpaceAtBegin()) {
                new (this->begin() - 1) T(std::forward<Args>(args)...);
                --this->ptr;
                ++this->size;
                return;
            }
        }
        T tmp(std::forward<Args>(args)...);
        typename QArrayData::GrowthPosition pos = QArrayData::GrowsAtEnd;
        if (this->size != 0 && i == 0)
            pos = QArrayData::GrowsAtBeginning;

        this->detachAndGrow(pos, 1, nullptr, nullptr);

        T *where = createHole(pos, i, 1);
        new (where) T(std::move(tmp));
    }